

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameracollection.cc
# Opt level: O1

void __thiscall gvr::CameraCollection::loadPLY(CameraCollection *this,PLYReader *ply)

{
  IOException *this_00;
  string local_40;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot load camera collection from PLY.","");
  gutil::IOException::IOException(this_00,&local_40);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void CameraCollection::loadPLY(PLYReader &ply)
{
  throw gutil::IOException("Cannot load camera collection from PLY.");
}